

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

vector<unsigned_long,_true> * __thiscall
duckdb::FunctionBinder::BindFunctionsFromArguments<duckdb::TableFunction>
          (vector<unsigned_long,_true> *__return_storage_ptr__,FunctionBinder *this,string *name,
          FunctionSet<duckdb::TableFunction> *functions,vector<duckdb::LogicalType,_true> *arguments
          ,ErrorData *error)

{
  iterator iVar1;
  pointer puVar2;
  ErrorData *pEVar3;
  undefined1 auVar4 [8];
  reference func;
  idx_t iVar5;
  ulong uVar6;
  pointer pTVar7;
  pointer pTVar8;
  optional_idx best_function;
  optional_idx bind_cost;
  optional_idx local_f8;
  vector<duckdb::LogicalType,_true> *local_f0;
  BinderException local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d8;
  ErrorData *local_c0;
  string *local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  char local_a0 [8];
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_f8.index = 0xffffffffffffffff;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0 = (undefined1  [8])0x0;
  pTVar7 = (functions->functions).
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data._M_start;
  pTVar8 = (functions->functions).
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_f0 = arguments;
  local_c0 = error;
  local_b8 = name;
  if (pTVar8 != pTVar7) {
    uVar6 = 0xffffffffffffffff;
    do {
      func = vector<duckdb::TableFunction,_true>::operator[]
                       (&functions->functions,(size_type)local_b0);
      local_d8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)BindFunctionCost(this,(SimpleFunction *)func,local_f0);
      if (local_d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0xffffffffffffffff) {
        iVar5 = optional_idx::GetIndex((optional_idx *)&local_d8);
        if (iVar5 == uVar6) {
          iVar1._M_current =
               (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__
                       ,iVar1,(unsigned_long *)local_b0);
          }
          else {
            *iVar1._M_current = (unsigned_long)local_b0;
            (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        else if (iVar5 <= uVar6) {
          puVar2 = (__return_storage_ptr__->
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar2) {
            (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar2;
          }
          optional_idx::optional_idx((optional_idx *)&local_e8,(idx_t)local_b0);
          local_f8.index = local_e8.super_Exception._0_8_;
          uVar6 = iVar5;
        }
      }
      local_b0 = (undefined1  [8])((long)local_b0 + 1);
      pTVar7 = (functions->functions).
               super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
               super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar8 = (functions->functions).
               super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
               super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while ((ulong)local_b0 < (char *)(((long)pTVar8 - (long)pTVar7 >> 3) * 0x6fb586fb586fb587));
  }
  if (local_f8.index == 0xffffffffffffffff) {
    local_d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar7 != pTVar8) {
      do {
        (*(pTVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
          _vptr_Function[2])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   pTVar7);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
        if (local_b0 != (undefined1  [8])local_a0) {
          operator_delete((void *)local_b0);
        }
        pTVar7 = pTVar7 + 1;
      } while (pTVar7 != pTVar8);
    }
    BinderException::NoMatchingFunction(&local_e8,local_b8,local_f0,&local_d8);
    ErrorData::ErrorData((ErrorData *)local_b0,(exception *)&local_e8);
    auVar4 = local_b0;
    pEVar3 = local_c0;
    local_c0->initialized = (bool)local_b0[0];
    local_c0->type = local_b0[1];
    local_b0 = auVar4;
    ::std::__cxx11::string::operator=((string *)&local_c0->raw_message,(string *)&local_a8);
    ::std::__cxx11::string::operator=((string *)&pEVar3->final_message,(string *)&local_88);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pEVar3->extra_info,local_68);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_68);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    ::std::runtime_error::~runtime_error((runtime_error *)&local_e8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
  }
  else {
    local_b0 = (undefined1  [8])optional_idx::GetIndex(&local_f8);
    iVar1._M_current =
         (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&__return_storage_ptr__->
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>,iVar1,
                 (unsigned_long *)local_b0);
    }
    else {
      *iVar1._M_current = (unsigned_long)local_b0;
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> FunctionBinder::BindFunctionsFromArguments(const string &name, FunctionSet<T> &functions,
                                                         const vector<LogicalType> &arguments, ErrorData &error) {
	optional_idx best_function;
	idx_t lowest_cost = NumericLimits<idx_t>::Maximum();
	vector<idx_t> candidate_functions;
	for (idx_t f_idx = 0; f_idx < functions.functions.size(); f_idx++) {
		auto &func = functions.functions[f_idx];
		// check the arguments of the function
		auto bind_cost = BindFunctionCost(func, arguments);
		if (!bind_cost.IsValid()) {
			// auto casting was not possible
			continue;
		}
		auto cost = bind_cost.GetIndex();
		if (cost == lowest_cost) {
			candidate_functions.push_back(f_idx);
			continue;
		}
		if (cost > lowest_cost) {
			continue;
		}
		candidate_functions.clear();
		lowest_cost = cost;
		best_function = f_idx;
	}
	if (!best_function.IsValid()) {
		// no matching function was found, throw an error
		vector<string> candidates;
		for (auto &f : functions.functions) {
			candidates.push_back(f.ToString());
		}
		error = ErrorData(BinderException::NoMatchingFunction(name, arguments, candidates));
		return candidate_functions;
	}
	candidate_functions.push_back(best_function.GetIndex());
	return candidate_functions;
}